

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

leb__HeapArgs *
leb__CreateHeapArgs(leb__HeapArgs *__return_storage_ptr__,leb_Heap *leb,leb_Node node,
                   int32_t bitCount)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = ((leb->maxDepth - node.depth) + 1) * node.id + (2 << ((byte)node.depth & 0x1f));
  uVar3 = ((uint)(1 << ((char)leb->maxDepth + 2U & 0x1f)) >> 5) - 1;
  uVar2 = uVar5 >> 5;
  uVar4 = uVar2 + 1;
  if (uVar4 < uVar3) {
    uVar3 = uVar4;
  }
  uVar5 = uVar5 & 0x1f;
  __return_storage_ptr__->bitOffsetLSB = uVar5;
  uVar5 = 0x20 - uVar5;
  if ((uint)bitCount <= uVar5) {
    uVar5 = bitCount;
  }
  __return_storage_ptr__->bitCountLSB = uVar5;
  __return_storage_ptr__->bitCountMSB = bitCount - uVar5;
  puVar1 = leb->buffer;
  __return_storage_ptr__->bitFieldLSB = puVar1 + uVar2;
  __return_storage_ptr__->bitFieldMSB = puVar1 + uVar3;
  return __return_storage_ptr__;
}

Assistant:

leb__HeapArgs
leb__CreateHeapArgs(const leb_Heap *leb, const leb_Node node, int32_t bitCount)
{
    uint32_t alignedBitOffset = leb__NodeBitID(leb, node);
    uint32_t maxBufferIndex = leb__HeapUint32Size(leb->maxDepth) - 1u;
    uint32_t lebBufferIndexLSB = (alignedBitOffset >> 5u);
    uint32_t lebBufferIndexMSB = leb__MinValue(lebBufferIndexLSB + 1, maxBufferIndex);
    leb__HeapArgs args;

    args.bitOffsetLSB = alignedBitOffset & 31u;
    args.bitCountLSB = leb__MinValue(32u - args.bitOffsetLSB, bitCount);
    args.bitCountMSB = bitCount - args.bitCountLSB;
    args.bitFieldLSB = &leb->buffer[lebBufferIndexLSB];
    args.bitFieldMSB = &leb->buffer[lebBufferIndexMSB];

    return args;
}